

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::EndTabItem(void)

{
  short sVar1;
  ImGuiTabBar *pIVar2;
  
  if (GImGui->CurrentWindow->SkipItems == false) {
    pIVar2 = GImGui->CurrentTabBar;
    if (pIVar2 == (ImGuiTabBar *)0x0) {
      __assert_fail("(tab_bar != __null) && \"Needs to be called between BeginTabBar() and EndTabBar()!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                    ,0x1d6a,"void ImGui::EndTabItem()");
    }
    sVar1 = pIVar2->LastTabItemIdx;
    if (sVar1 < 0) {
      __assert_fail("tab_bar->LastTabItemIdx >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                    ,0x1d6d,"void ImGui::EndTabItem()");
    }
    if ((pIVar2->Tabs).Size <= (int)sVar1) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                    ,0x658,"T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]");
    }
    if (((pIVar2->Tabs).Data[(int)sVar1].Flags & 8) == 0) {
      PopID();
      return;
    }
  }
  return;
}

Assistant:

void    ImGui::EndTabItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Needs to be called between BeginTabBar() and EndTabBar()!");
        return;
    }
    IM_ASSERT(tab_bar->LastTabItemIdx >= 0);
    ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
    if (!(tab->Flags & ImGuiTabItemFlags_NoPushId))
        PopID();
}